

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O3

void FreeUserData(WebData wdata)

{
  int iVar1;
  long lVar2;
  
  iVar1 = wdata->ngrp;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      SUNDlsMat_destroyMat(wdata->P[lVar2]);
      SUNDlsMat_destroyArray(wdata->pivot[lVar2]);
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  N_VDestroy(wdata->rewt);
  N_VDestroy(wdata->vtemp);
  N_VDestroy(wdata->rewtB);
  N_VDestroy(wdata->vtempB);
  free(wdata);
  return;
}

Assistant:

static void FreeUserData(WebData wdata)
{
  int i, ngrp;

  ngrp = wdata->ngrp;
  for (i = 0; i < ngrp; i++)
  {
    SUNDlsMat_destroyMat((wdata->P)[i]);
    SUNDlsMat_destroyArray((wdata->pivot)[i]);
  }
  N_VDestroy(wdata->rewt);
  N_VDestroy(wdata->vtemp);
  N_VDestroy(wdata->rewtB);
  N_VDestroy(wdata->vtempB);
  free(wdata);
}